

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

torrent_info * __thiscall
libtorrent::torrent_info::operator=(torrent_info *this,torrent_info *param_1)

{
  _Head_base<0UL,_const_libtorrent::file_storage_*,_false> __p;
  char *pcVar1;
  sp_counted_base *psVar2;
  bdecode_token *pbVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int32_t iVar12;
  char *__tmp;
  shared_count local_20;
  
  file_storage::operator=(&this->m_files,&param_1->m_files);
  __p._M_head_impl =
       (param_1->m_orig_files).m_ptr._M_t.
       super___uniq_ptr_impl<const_libtorrent::file_storage,_std::default_delete<const_libtorrent::file_storage>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_libtorrent::file_storage_*,_std::default_delete<const_libtorrent::file_storage>_>
       .super__Head_base<0UL,_const_libtorrent::file_storage_*,_false>._M_head_impl;
  (param_1->m_orig_files).m_ptr._M_t.
  super___uniq_ptr_impl<const_libtorrent::file_storage,_std::default_delete<const_libtorrent::file_storage>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_libtorrent::file_storage_*,_std::default_delete<const_libtorrent::file_storage>_>
  .super__Head_base<0UL,_const_libtorrent::file_storage_*,_false>._M_head_impl = (file_storage *)0x0
  ;
  ::std::
  __uniq_ptr_impl<const_libtorrent::file_storage,_std::default_delete<const_libtorrent::file_storage>_>
  ::reset((__uniq_ptr_impl<const_libtorrent::file_storage,_std::default_delete<const_libtorrent::file_storage>_>
           *)&this->m_orig_files,__p._M_head_impl);
  ::std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  ::_M_move_assign(&(this->m_urls).
                    super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                   ,&param_1->m_urls);
  ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::
  _M_move_assign(&this->m_web_seeds,&param_1->m_web_seeds);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::_M_move_assign(&this->m_nodes,&param_1->m_nodes);
  ::std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&this->m_similar_torrents,&param_1->m_similar_torrents);
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
  _M_move_assign(&this->m_owned_similar_torrents,&param_1->m_owned_similar_torrents);
  ::std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_move_assign
            (&this->m_collections,&param_1->m_collections);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->m_owned_collections,&param_1->m_owned_collections);
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
  _M_move_assign(&(this->m_merkle_tree).
                  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 ,&param_1->m_merkle_tree);
  ::std::
  vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::_M_move_assign(&(this->m_piece_layers).
                    super_vector<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<libtorrent::aux::container_wrapper<char,_int,_std::vector<char,_std::allocator<char>_>_>_>_>
                   ,&param_1->m_piece_layers);
  pcVar1 = (param_1->m_info_section).px;
  psVar2 = (param_1->m_info_section).pn.pi_;
  (param_1->m_info_section).pn.pi_ = (sp_counted_base *)0x0;
  (param_1->m_info_section).px = (char *)0x0;
  (this->m_info_section).px = pcVar1;
  local_20.pi_ = (this->m_info_section).pn.pi_;
  (this->m_info_section).pn.pi_ = psVar2;
  boost::detail::shared_count::~shared_count(&local_20);
  ::std::__cxx11::string::operator=((string *)&this->m_comment,(string *)&param_1->m_comment);
  ::std::__cxx11::string::operator=((string *)&this->m_created_by,(string *)&param_1->m_created_by);
  ::std::vector<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>::
  _M_move_assign(&(this->m_info_dict).m_tokens,&param_1->m_info_dict);
  (this->m_info_dict).m_size = (param_1->m_info_dict).m_size;
  pbVar3 = (param_1->m_info_dict).m_root_tokens;
  pcVar1 = (param_1->m_info_dict).m_buffer;
  iVar9 = (param_1->m_info_dict).m_token_idx;
  iVar10 = (param_1->m_info_dict).m_last_index;
  iVar11 = (param_1->m_info_dict).m_last_token;
  (this->m_info_dict).m_buffer_size = (param_1->m_info_dict).m_buffer_size;
  (this->m_info_dict).m_token_idx = iVar9;
  (this->m_info_dict).m_last_index = iVar10;
  (this->m_info_dict).m_last_token = iVar11;
  (this->m_info_dict).m_root_tokens = pbVar3;
  (this->m_info_dict).m_buffer = pcVar1;
  this->m_creation_date = param_1->m_creation_date;
  (this->m_info_hash).v2.m_number._M_elems[7] = (param_1->m_info_hash).v2.m_number._M_elems[7];
  uVar4 = *(undefined8 *)(param_1->m_info_hash).v1.m_number._M_elems;
  uVar5 = *(undefined8 *)((param_1->m_info_hash).v1.m_number._M_elems + 2);
  uVar6 = *(undefined8 *)((param_1->m_info_hash).v1.m_number._M_elems + 4);
  uVar7 = *(undefined8 *)((param_1->m_info_hash).v2.m_number._M_elems + 1);
  uVar8 = *(undefined8 *)((param_1->m_info_hash).v2.m_number._M_elems + 5);
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 3) =
       *(undefined8 *)((param_1->m_info_hash).v2.m_number._M_elems + 3);
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 5) = uVar8;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = uVar6;
  *(undefined8 *)((this->m_info_hash).v2.m_number._M_elems + 1) = uVar7;
  *(undefined8 *)(this->m_info_hash).v1.m_number._M_elems = uVar4;
  *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) = uVar5;
  iVar12 = param_1->m_info_section_size;
  this->m_piece_hashes = param_1->m_piece_hashes;
  this->m_info_section_size = iVar12;
  (this->m_flags).m_val = (param_1->m_flags).m_val;
  return this;
}

Assistant:

bool torrent_info::resolve_duplicate_filenames(int const max_duplicate_filenames
		, error_code& ec)
	{
		INVARIANT_CHECK;

		std::unordered_set<std::uint32_t> files;

		std::string const empty_str;

		// insert all directories first, to make sure no files
		// are allowed to collied with them
		m_files.all_path_hashes(files);
		for (auto const i : m_files.file_range())
		{
			// as long as this file already exists
			// increase the counter
			std::uint32_t const h = m_files.file_path_hash(i, empty_str);
			if (!files.insert(h).second)
			{
				// This filename appears to already exist!
				// If this happens, just start over and do it the slow way,
				// comparing full file names and come up with new names
				return resolve_duplicate_filenames_slow(max_duplicate_filenames, ec);
			}
		}
		return true;
	}